

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

int lj_trace_flushall(lua_State *L)

{
  undefined4 *puVar1;
  lua_State *L_00;
  ptrdiff_t argbase_00;
  GCstr *pGVar2;
  long in_RDI;
  ptrdiff_t argbase;
  GCtrace *T;
  ptrdiff_t i;
  jit_State *J;
  GCtrace *in_stack_ffffffffffffff68;
  jit_State *in_stack_ffffffffffffff70;
  ulong uVar3;
  VMEvent ev;
  int local_6c;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  uVar3 = (ulong)*(uint *)(in_RDI + 8);
  L_00 = (lua_State *)(uVar3 + 0x248);
  if ((*(byte *)(uVar3 + 0x109) & 0x40) == 0) {
    uVar3 = (ulong)*(uint *)(uVar3 + 0x3c4);
    while (uVar3 = uVar3 - 1, 0 < (long)uVar3) {
      in_stack_ffffffffffffff70 = (jit_State *)(ulong)*(uint *)((long)L_00[5].cframe + uVar3 * 4);
      if (in_stack_ffffffffffffff70 != (jit_State *)0x0) {
        if ((in_stack_ffffffffffffff70->cur).root == 0) {
          trace_flushroot(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        }
        (in_stack_ffffffffffffff70->cur).link = 0;
        (in_stack_ffffffffffffff70->cur).traceno = 0;
        *(undefined4 *)((long)L_00[5].cframe + uVar3 * 4) = 0;
      }
    }
    *(undefined2 *)&L_00[1].base = 0;
    L_00[5].stacksize = 0;
    memset(L_00 + 0x1c,0,0x200);
    ev = (VMEvent)(uVar3 >> 0x20);
    lj_mcode_free(in_stack_ffffffffffffff70);
    memset(L_00 + 0x1a,0,0x80);
    if (((*(byte *)((ulong)*(uint *)(in_RDI + 8) + 0x10b) & 2) != 0) &&
       (argbase_00 = lj_vmevent_prepare(L_00,ev), argbase_00 != 0)) {
      puVar1 = *(undefined4 **)(in_RDI + 0x18);
      *(undefined4 **)(in_RDI + 0x18) = puVar1 + 2;
      pGVar2 = lj_str_new((lua_State *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                          ,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      *puVar1 = (int)pGVar2;
      puVar1[1] = 0xfffffffb;
      lj_vmevent_call((lua_State *)in_stack_ffffffffffffff70,argbase_00);
    }
    local_6c = 0;
  }
  else {
    local_6c = 1;
  }
  return local_6c;
}

Assistant:

int lj_trace_flushall(lua_State *L)
{
  jit_State *J = L2J(L);
  ptrdiff_t i;
  if ((J2G(J)->hookmask & HOOK_GC))
    return 1;
  for (i = (ptrdiff_t)J->sizetrace-1; i > 0; i--) {
    GCtrace *T = traceref(J, i);
    if (T) {
      if (T->root == 0)
	trace_flushroot(J, T);
      lj_gdbjit_deltrace(J, T);
      T->traceno = T->link = 0;  /* Blacklist the link for cont_stitch. */
      setgcrefnull(J->trace[i]);
    }
  }
  J->cur.traceno = 0;
  J->freetrace = 0;
  /* Clear penalty cache. */
  memset(J->penalty, 0, sizeof(J->penalty));
  /* Free the whole machine code and invalidate all exit stub groups. */
  lj_mcode_free(J);
  memset(J->exitstubgroup, 0, sizeof(J->exitstubgroup));
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "flush"));
  );
  return 0;
}